

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_bspline.cpp
# Opt level: O1

double __thiscall agg::bspline::get_stateful(bspline *this,double x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  
  iVar5 = this->m_num;
  lVar4 = (long)iVar5;
  if (lVar4 < 3) {
    return 0.0;
  }
  pdVar3 = this->m_x;
  dVar9 = *pdVar3;
  if (x < dVar9) {
    dVar1 = *this->m_y;
    return (x - dVar9) *
           ((this->m_y[1] - dVar1) / (pdVar3[1] - dVar9) +
           ((this->m_am).m_array[1] * (pdVar3[1] - dVar9)) / -6.0) + dVar1;
  }
  if (pdVar3[lVar4 + -1] <= x) {
    dVar9 = this->m_y[lVar4 + -1];
    return (x - pdVar3[lVar4 + -1]) *
           ((dVar9 - this->m_y[lVar4 + -2]) / (pdVar3[lVar4 + -1] - pdVar3[lVar4 + -2]) +
           ((this->m_am).m_array[lVar4 - 2U & 0xffffffff] *
           (pdVar3[lVar4 + -1] - pdVar3[lVar4 + -2])) / 6.0) + dVar9;
  }
  uVar2 = this->m_last_idx;
  uVar7 = (ulong)uVar2;
  if ((int)uVar2 < 0) {
    this->m_last_idx = 0;
    iVar5 = iVar5 + -1;
    iVar6 = 0;
    do {
      iVar8 = iVar6 + iVar5 >> 1;
      if (pdVar3[iVar8] <= x) {
        this->m_last_idx = iVar8;
        iVar6 = iVar8;
        iVar8 = iVar5;
      }
      iVar5 = iVar8;
    } while (1 < iVar5 - iVar6);
  }
  else if ((x < pdVar3[uVar7]) || (pdVar3[uVar7 + 1] <= x && x != pdVar3[uVar7 + 1])) {
    if ((iVar5 + -2 <= (int)uVar2) || ((x < pdVar3[uVar7 + 1] || (pdVar3[uVar7 + 2] < x)))) {
      if ((uVar7 == 0) || ((pdVar3[uVar7] < x || (x < pdVar3[uVar7 - 1])))) {
        this->m_last_idx = 0;
        iVar5 = iVar5 + -1;
        iVar6 = 0;
        do {
          iVar8 = iVar6 + iVar5 >> 1;
          if (pdVar3[iVar8] <= x) {
            this->m_last_idx = iVar8;
            iVar6 = iVar8;
            iVar8 = iVar5;
          }
          iVar5 = iVar8;
        } while (1 < iVar5 - iVar6);
        goto LAB_001132ad;
      }
      iVar5 = uVar2 - 1;
    }
    else {
      iVar5 = uVar2 + 1;
    }
    this->m_last_idx = iVar5;
  }
LAB_001132ad:
  dVar9 = interpolation(this,x,this->m_last_idx);
  return dVar9;
}

Assistant:

double bspline::get_stateful(double x) const
    {
        if(m_num > 2)
        {
            // Extrapolation on the left
            if(x < m_x[0]) return extrapolation_left(x);

            // Extrapolation on the right
            if(x >= m_x[m_num - 1]) return extrapolation_right(x);

            if(m_last_idx >= 0)
            {
                // Check if x is not in current range
                if(x < m_x[m_last_idx] || x > m_x[m_last_idx + 1])
                {
                    // Check if x between next points (most probably)
                    if(m_last_idx < m_num - 2 && 
                       x >= m_x[m_last_idx + 1] &&
                       x <= m_x[m_last_idx + 2])
                    {
                        ++m_last_idx;
                    }
                    else
                    if(m_last_idx > 0 && 
                       x >= m_x[m_last_idx - 1] && 
                       x <= m_x[m_last_idx])
                    {
                        // x is between pevious points
                        --m_last_idx;
                    }
                    else
                    {
                        // Else perform full search
                        bsearch(m_num, m_x, x, &m_last_idx);
                    }
                }
                return interpolation(x, m_last_idx);
            }
            else
            {
                // Interpolation
                bsearch(m_num, m_x, x, &m_last_idx);
                return interpolation(x, m_last_idx);
            }
        }
        return 0.0;
    }